

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O2

bool parse_pattern(GlobalVars *gv,char *keyword,char **fpat,char ***spatlist)

{
  size_t size;
  char cVar1;
  int iVar2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char **__dest;
  uint uVar7;
  ulong uVar8;
  char *patternlist [64];
  
  gv->scriptflags = gv->scriptflags & 0xf8;
  iVar2 = strcmp(keyword,"KEEP");
  if (iVar2 == 0) {
    keyword = getpattern();
    if (keyword == (char *)0x0) goto LAB_00111cbe;
    cVar1 = getchr();
    if (cVar1 != '(') goto LAB_00111d4e;
    gv->scriptflags = gv->scriptflags | 1;
  }
  iVar2 = strcmp(keyword,"SORT");
  if (iVar2 == 0) {
    keyword = getpattern();
    if (keyword == (char *)0x0) {
LAB_00111cbe:
      pcVar5 = scriptname;
      uVar7 = getlineno();
      error(0x4e,pcVar5,(ulong)uVar7);
      return 0;
    }
    cVar1 = getchr();
    if (cVar1 != '(') {
LAB_00111d4e:
      pcVar5 = scriptname;
      uVar7 = getlineno();
      error(0x42,pcVar5,(ulong)uVar7,0x28);
      back(1);
      return 0;
    }
    gv->scriptflags = gv->scriptflags | 2;
  }
  sVar4 = strlen(keyword);
  pcVar5 = (char *)alloc(sVar4 + 1);
  *fpat = pcVar5;
  strcpy(pcVar5,keyword);
  if (((gv->scriptflags & 2) == 0) || (bVar3 = endofblock('(',')'), bVar3 != 0)) {
    uVar7 = 0;
    while( true ) {
      pcVar5 = getpattern();
      uVar8 = (ulong)uVar7;
      if (pcVar5 == (char *)0x0) break;
      iVar2 = strcmp(pcVar5,"SORT");
      if (iVar2 == 0) {
        cVar1 = getchr();
        pcVar5 = scriptname;
        if (cVar1 != '(') {
          uVar7 = getlineno();
          error(0x42,pcVar5,(ulong)uVar7,0x28);
          back(1);
LAB_00111dd5:
          free(*fpat);
          return 0;
        }
        pcVar5 = getpattern();
        pcVar6 = scriptname;
        if (pcVar5 == (char *)0x0) {
          uVar7 = getlineno();
          error(0x4e,pcVar6,(ulong)uVar7);
          goto LAB_00111dd5;
        }
        bVar3 = endofblock('(',')');
        if (bVar3 == 0) {
          pcVar5 = *fpat;
          goto LAB_00111dea;
        }
        gv->scriptflags = gv->scriptflags | 4;
      }
      if (uVar7 < 0x3f) {
        sVar4 = strlen(pcVar5);
        pcVar6 = (char *)alloc((iVar2 == 0) + sVar4 + 1);
        patternlist[uVar8] = pcVar6;
        if (iVar2 == 0) {
          *pcVar6 = '$';
          pcVar6 = pcVar6 + 1;
        }
        strcpy(pcVar6,pcVar5);
        uVar7 = uVar7 + 1;
      }
      else {
        ierror("parse_pattern(): pattern buffer overrun");
      }
    }
    patternlist[uVar8] = (char *)0x0;
    size = uVar8 * 8 + 8;
    __dest = (char **)alloc(size);
    *spatlist = __dest;
    memcpy(__dest,patternlist,size);
    bVar3 = endofblock('(',')');
    if (bVar3 == 0) {
      pcVar5 = *fpat;
    }
    else {
      if ((gv->scriptflags & 1) == 0) {
        return 1;
      }
      bVar3 = endofblock('(',')');
      if (bVar3 != 0) {
        return 1;
      }
      pcVar5 = *fpat;
    }
    free_patterns(pcVar5,*spatlist);
  }
  else {
    pcVar5 = *fpat;
LAB_00111dea:
    free(pcVar5);
  }
  return 0;
}

Assistant:

static bool parse_pattern(struct GlobalVars *gv,char *keyword,
                          char **fpat,char ***spatlist)
/* parse file/section-pattern and allocate pattern-lists */
{
  const char *sortcmd = "SORT";
  char *patternlist[64];   /* yes... it's ugly :| */
  int pcnt = 0;
  bool sortsec;

  gv->scriptflags &= ~(LDSF_KEEP | LDSF_SORTFIL | LDSF_SORTSEC);
  if (!strcmp(keyword,"KEEP")) {
    if (keyword = getpattern()) {
      if (getchr() != '(') {
        error(66,scriptname,getlineno(),'(');  /* '(' expected */
        back(1);
        return FALSE;
      }
    }
    else {
      error(78,scriptname,getlineno());   /* missing argument */
      return FALSE;
    }
    gv->scriptflags |= LDSF_KEEP;
  }

  if (!strcmp(keyword,sortcmd)) {
    if (keyword = getpattern()) {
      if (getchr() != '(') {
        error(66,scriptname,getlineno(),'(');  /* '(' expected */
        back(1);
        return FALSE;
      }
    }
    else {
      error(78,scriptname,getlineno());   /* missing argument */
      return FALSE;
    }
    gv->scriptflags |= LDSF_SORTFIL;
  }
  *fpat = alloc(strlen(keyword)+1);
  strcpy(*fpat,keyword);
  if (gv->scriptflags & LDSF_SORTFIL) {
    if (!endofblock('(',')')) {
      free(*fpat);
      return FALSE;
    }
  }

  while (keyword = getpattern()) {
    sortsec = FALSE;
    if (!strcmp(keyword,sortcmd)) {
      if (getchr() == '(') {
        if (!(keyword = getpattern())) {
          error(78,scriptname,getlineno());   /* missing argument */
          free(*fpat);
          return FALSE;
        }
      }
      else {
        error(66,scriptname,getlineno(),'(');  /* '(' expected */
        back(1);
        free(*fpat);
        return FALSE;
      }
      if (!endofblock('(',')')) {
        free(*fpat);
        return FALSE;
      }
      gv->scriptflags |= LDSF_SORTSEC;
      sortsec = TRUE;
    }

    if (pcnt < 63) {
      patternlist[pcnt] = alloc(strlen(keyword) + (sortsec ? 2 : 1));
      if (sortsec) {
        *patternlist[pcnt] = '$';   /* indicate sort-request */
        strcpy(patternlist[pcnt]+1,keyword);
      }
      else
        strcpy(patternlist[pcnt],keyword);
      pcnt++;
    }
    else
      ierror("parse_pattern(): pattern buffer overrun");
  }

  patternlist[pcnt++] = NULL;
  *spatlist = alloc(pcnt * sizeof(char *));
  memcpy(*spatlist,patternlist,pcnt*sizeof(char *));

  if (!endofblock('(',')')) {
    free_patterns(*fpat,*spatlist);
    return FALSE;
  }
  if (gv->scriptflags & LDSF_KEEP) {
    if (!endofblock('(',')')) {
      free_patterns(*fpat,*spatlist);
      return FALSE;
    }
  }
  return TRUE;
}